

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall LTAircraft::LabelUpdate(LTAircraft *this)

{
  XPLMDataRef pvVar1;
  bool bVar2;
  DataRefs *in_RDI;
  LTFlightData *in_stack_00000198;
  float *in_stack_ffffffffffffffc8;
  string local_28 [40];
  
  LTFlightData::ComposeLabel_abi_cxx11_(in_stack_00000198);
  std::__cxx11::string::operator=((string *)(in_RDI->adrXP + 0x16),local_28);
  std::__cxx11::string::~string(local_28);
  bVar2 = DataRefs::IsLabelColorDynamic(&dataRefs);
  if (bVar2) {
    pvVar1 = *(XPLMDataRef *)((long)in_RDI->adrLT[0x4c] + 0x138);
    in_RDI->adrXP[0x1a] = *(XPLMDataRef *)((long)in_RDI->adrLT[0x4c] + 0x130);
    in_RDI->adrXP[0x1b] = pvVar1;
  }
  else {
    DataRefs::GetLabelColor(in_RDI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void LTAircraft::LabelUpdate()
{
    label = fd.ComposeLabel();
    
    // color depends on setting and maybe model
    if (dataRefs.IsLabelColorDynamic())
        memmove(colLabel, pMdl->LABEL_COLOR, sizeof(colLabel));
    else
        dataRefs.GetLabelColor(colLabel);
}